

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat.hpp
# Opt level: O0

mat4f * operator*(mat4f *a,mat4f *b)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  mat4f *in_RDX;
  mat4f *in_RSI;
  mat4f *in_RDI;
  int k;
  int j;
  int i;
  uint local_1c;
  int local_18;
  uint local_14;
  
  mat4f::mat4f((mat4f *)0x18e230);
  for (local_14 = 0; (int)local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      for (local_1c = 0; (int)local_1c < 4; local_1c = local_1c + 1) {
        pfVar3 = mat4f::operator[](in_RSI,local_14);
        fVar1 = pfVar3[(int)local_1c];
        pfVar3 = mat4f::operator[](in_RDX,local_1c);
        fVar2 = pfVar3[local_18];
        pfVar3 = mat4f::operator[](in_RDI,local_14);
        pfVar3[local_18] = fVar1 * fVar2 + pfVar3[local_18];
      }
    }
  }
  return in_RDI;
}

Assistant:

inline mat4f operator * (const mat4f& a, const mat4f& b)
{
	mat4f res;
	for (int i=0; i<4; ++i)
		for (int j=0; j<4; ++j)
			for (int k=0; k<4; ++k)
				res[i][j] += a[i][k] * b[k][j];
	return res;
}